

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagebox.cpp
# Opt level: O0

void __thiscall QtMWidgets::MessageBoxPrivate::adjustSize(MessageBoxPrivate *this)

{
  undefined4 uVar1;
  undefined4 w;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  QAbstractButton **ppQVar9;
  QRect QVar10;
  QPoint local_e0;
  QPoint p;
  QSize local_d0;
  int local_c8;
  int iStack_c4;
  int width_2;
  int local_bc;
  double dStack_b8;
  int width_1;
  qreal factor;
  QSize local_a8;
  QAbstractButton *local_a0;
  QAbstractButton *btn;
  TableViewCell **local_88;
  undefined1 local_80 [8];
  QForeachContainer<QList<QAbstractButton_*>_> _container_252;
  int width;
  undefined1 local_30 [8];
  QRect wr;
  QSize s;
  QSize ws;
  MessageBoxPrivate *this_local;
  
  QGuiApplication::primaryScreen();
  s = (QSize)QScreen::availableSize();
  wr._8_8_ = QWidget::size((QWidget *)this->q);
  QGuiApplication::primaryScreen();
  QVar10 = (QRect)QScreen::availableGeometry();
  wr._0_8_ = QVar10._8_8_;
  local_30 = QVar10._0_8_;
  if (this->window != (QWidget *)0x0) {
    s = QWidget::size(this->window);
    QVar10 = QWidget::rect(this->window);
  }
  wr._0_8_ = QVar10._8_8_;
  local_30 = QVar10._0_8_;
  _container_252._44_4_ = 0;
  QtPrivate::qMakeForeachContainer<QList<QAbstractButton*>&>
            ((QForeachContainer<QList<QAbstractButton_*>_> *)local_80,(QtPrivate *)&this->buttons,
             (QList<QAbstractButton_*> *)wr._0_8_);
  while( true ) {
    local_88 = _container_252.i.i;
    bVar2 = QList<QAbstractButton_*>::const_iterator::operator!=
                      ((const_iterator *)&_container_252.c.d.size,_container_252.i);
    if (!bVar2) break;
    ppQVar9 = QList<QAbstractButton_*>::const_iterator::operator*
                        ((const_iterator *)&_container_252.c.d.size);
    local_a0 = *ppQVar9;
    local_a8 = (QSize)(**(code **)(*(long *)local_a0 + 0x70))();
    iVar3 = QSize::width(&local_a8);
    _container_252._44_4_ = iVar3 + _container_252._44_4_;
    QList<QAbstractButton_*>::const_iterator::operator++((const_iterator *)&_container_252.c.d.size)
    ;
  }
  QtPrivate::QForeachContainer<QList<QAbstractButton_*>_>::~QForeachContainer
            ((QForeachContainer<QList<QAbstractButton_*>_> *)local_80);
  uVar1 = _container_252._44_4_;
  iVar3 = QSize::width((QSize *)&wr.x2);
  w = _container_252._44_4_;
  if (iVar3 < (int)uVar1) {
    iVar3 = (**(code **)(*(long *)this->textLabel + 0x80))(this->textLabel,_container_252._44_4_);
    iVar4 = QWidget::height(&this->title->super_QWidget);
    iVar5 = QWidget::height((QWidget *)this->okButton);
    iVar6 = QWidget::height((QWidget *)this->h1);
    iVar7 = QWidget::height((QWidget *)this->h2);
    QSize::QSize((QSize *)&factor,w,iVar3 + iVar4 + iVar5 + iVar6 + iVar7);
    wr._8_8_ = factor;
  }
  iVar3 = QSize::height((QSize *)&wr.x2);
  iVar4 = QSize::width((QSize *)&wr.x2);
  dStack_b8 = (double)iVar3 / (double)iVar4;
  if (1.5 < dStack_b8) {
    iVar3 = QSize::width((QSize *)&wr.x2);
    iVar3 = qRound((double)iVar3 * dStack_b8);
    local_bc = iVar3;
    iVar4 = (**(code **)(*(long *)this->textLabel + 0x80))(this->textLabel,iVar3);
    iVar5 = QWidget::height(&this->title->super_QWidget);
    iVar6 = QWidget::height((QWidget *)this->okButton);
    iVar7 = QWidget::height((QWidget *)this->h1);
    iVar8 = QWidget::height((QWidget *)this->h2);
    QSize::QSize((QSize *)&stack0xffffffffffffff3c,iVar3,iVar4 + iVar5 + iVar6 + iVar7 + iVar8);
    wr.x2 = iStack_c4;
    wr.y2 = width_2;
  }
  iVar3 = QSize::width((QSize *)&wr.x2);
  iVar4 = QSize::width(&s);
  if (iVar4 + this->screenMargin * -2 < iVar3) {
    iVar3 = QSize::width(&s);
    iVar3 = iVar3 + this->screenMargin * -2;
    local_c8 = iVar3;
    iVar4 = (**(code **)(*(long *)this->textLabel + 0x80))(this->textLabel,iVar3);
    iVar5 = QWidget::height(&this->title->super_QWidget);
    iVar6 = QWidget::height((QWidget *)this->okButton);
    iVar7 = QWidget::height((QWidget *)this->h1);
    iVar8 = QWidget::height((QWidget *)this->h2);
    QSize::QSize(&local_d0,iVar3,iVar4 + iVar5 + iVar6 + iVar7 + iVar8);
    wr.x2 = local_d0.wd;
    wr.y2 = local_d0.ht;
  }
  iVar3 = QSize::height((QSize *)&wr.x2);
  iVar4 = QSize::height(&s);
  if (iVar4 + this->screenMargin * -2 < iVar3) {
    iVar3 = QSize::width((QSize *)&wr.x2);
    iVar4 = QSize::height(&s);
    QSize::QSize((QSize *)&p,iVar3,iVar4 + this->screenMargin * -2);
    wr.x2 = p.xp;
    wr.y2 = p.yp;
  }
  QWidget::resize((QSize *)this->q);
  iVar3 = QRect::x((QRect *)local_30);
  iVar4 = QSize::width(&s);
  iVar5 = QSize::width((QSize *)&wr.x2);
  iVar6 = QRect::y((QRect *)local_30);
  iVar7 = QSize::height(&s);
  iVar8 = QSize::height((QSize *)&wr.x2);
  QPoint::QPoint(&local_e0,iVar3 + (iVar4 - iVar5) / 2,iVar6 + (iVar7 - iVar8) / 2);
  if (this->window != (QWidget *)0x0) {
    local_e0 = (QPoint)QWidget::mapToGlobal((QPoint *)this->window);
  }
  QWidget::move((QPoint *)this->q);
  QLayout::update();
  return;
}

Assistant:

void
MessageBoxPrivate::adjustSize()
{
	QSize ws = QApplication::primaryScreen()->availableSize();
	QSize s = q->size();
	QRect wr = QApplication::primaryScreen()->availableGeometry();

	if( window )
	{
		ws = window->size();
		wr = window->rect();
	}

	{
		int width = 0;

		foreach( QAbstractButton * btn, buttons )
			width += btn->sizeHint().width();

		if( width > s.width() )
			s = QSize( width,
					textLabel->heightForWidth( width ) + title->height() +
						okButton->height() + h1->height() + h2->height() );
	}

	qreal factor = (qreal) s.height() / (qreal) s.width();

	if( factor > 1.5 )
	{
		const int width = qRound( (qreal) s.width() * factor );

		s = QSize( width,
				textLabel->heightForWidth( width ) + title->height() +
					okButton->height() + h1->height() + h2->height() );
	}

	if( s.width() > ws.width() - screenMargin * 2 )
	{
		const int width = ws.width() - screenMargin * 2;

		s = QSize( width,
			textLabel->heightForWidth( width ) + title->height() +
				okButton->height() + h1->height() + h2->height() );
	}

	if( s.height() > ws.height() - screenMargin * 2 )
		s = QSize( s.width(), ws.height() - screenMargin * 2 );


	q->resize( s );

	QPoint p = QPoint( wr.x() + ( ws.width() - s.width() ) / 2,
		wr.y() + ( ws.height() - s.height() ) / 2 );

	if( window )
		p = window->mapToGlobal( p );

	q->move( p );

	vbox->update();
}